

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEigenAnalysis.cpp
# Opt level: O2

void __thiscall TPZEigenAnalysis::TPZEigenAnalysis(TPZEigenAnalysis *this)

{
  complex<double> *__s;
  
  TPZAnalysis::TPZAnalysis(&this->super_TPZAnalysis,&PTR_PTR_0179fae0);
  (this->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZEigenAnalysis_0179f9d8;
  (this->fEigenvalues).super_TPZVec<std::complex<double>_>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0164ea10;
  __s = (this->fEigenvalues).fExtAlloc;
  memset(__s,0,0xa0);
  (this->fEigenvalues).super_TPZVec<std::complex<double>_>.fStore = __s;
  (this->fEigenvalues).super_TPZVec<std::complex<double>_>.fNElements = 0;
  (this->fEigenvalues).super_TPZVec<std::complex<double>_>.fNAlloc = 0;
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(&this->fEigenvectors);
  this->fCalcVectors = true;
  return;
}

Assistant:

TPZEigenAnalysis::TPZEigenAnalysis()
  : TPZRegisterClassId(&TPZEigenAnalysis::ClassId),TPZAnalysis()
{

}